

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolorspace.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QColorSpace *colorSpace)

{
  QColorSpace *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QByteArray iccProfile;
  QColorSpace *in_stack_ffffffffffffffb8;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x4b813a);
  operator>>(in_RDI,(QByteArray *)&local_28);
  QColorSpace::fromIccProfile((QByteArray *)in_RDI);
  QColorSpace::operator=(in_RSI,in_stack_ffffffffffffffb8);
  QColorSpace::~QColorSpace((QColorSpace *)0x4b8173);
  QByteArray::~QByteArray((QByteArray *)0x4b8187);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QColorSpace &colorSpace)
{
    QByteArray iccProfile;
    s >> iccProfile;
    colorSpace = QColorSpace::fromIccProfile(iccProfile);
    return s;
}